

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool riscv_tr_breakpoint_check(DisasContextBase *dcbase,CPUState *cpu,CPUBreakpoint *bp)

{
  TCGContext_conflict11 *tcg_ctx;
  
  tcg_ctx = *(TCGContext_conflict11 **)(dcbase[2].pc_first + 0x2e8);
  tcg_gen_movi_i64_riscv64(tcg_ctx,tcg_ctx->cpu_pc,dcbase->pc_next);
  dcbase->is_jmp = DISAS_NORETURN;
  gen_exception_debug(tcg_ctx);
  dcbase->pc_next = dcbase->pc_next + 4;
  return true;
}

Assistant:

static bool riscv_tr_breakpoint_check(DisasContextBase *dcbase, CPUState *cpu,
                                      const CPUBreakpoint *bp)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->base.pc_next);
    ctx->base.is_jmp = DISAS_NORETURN;
    gen_exception_debug(tcg_ctx);
    /* The address covered by the breakpoint must be included in
       [tb->pc, tb->pc + tb->size) in order to for it to be
       properly cleared -- thus we increment the PC here so that
       the logic setting tb->size below does the right thing.  */
    ctx->base.pc_next += 4;
    return true;
}